

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

lzma_ret lzma_filters_update(lzma_stream *strm,lzma_filter *filters)

{
  uint64_t uVar1;
  undefined1 local_88 [8];
  lzma_filter reversed_filters [5];
  ulong local_30;
  size_t count;
  size_t i;
  lzma_filter *filters_local;
  lzma_stream *strm_local;
  
  local_30 = 1;
  if ((strm->internal->next).update ==
      (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict12 *
      )0x0) {
    strm_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    uVar1 = lzma_raw_encoder_memusage(filters);
    if (uVar1 == 0xffffffffffffffff) {
      strm_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
    else {
      for (; filters[local_30].id != 0xffffffffffffffff; local_30 = local_30 + 1) {
      }
      for (count = 0; count < local_30; count = count + 1) {
        reversed_filters[(local_30 - count) + -2].options = (void *)filters[count].id;
        reversed_filters[(local_30 - count) + -1].id = (lzma_vli)filters[count].options;
      }
      reversed_filters[local_30 - 1].options = (void *)0xffffffffffffffff;
      strm_local._4_4_ =
           (*(strm->internal->next).update)
                     ((strm->internal->next).coder,strm->allocator,filters,(lzma_filter *)local_88);
    }
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_update(lzma_stream *strm, const lzma_filter *filters)
{
	size_t i;
	size_t count = 1;
	lzma_filter reversed_filters[LZMA_FILTERS_MAX + 1];

	if (strm->internal->next.update == NULL)
		return LZMA_PROG_ERROR;

	// Validate the filter chain.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// The actual filter chain in the encoder is reversed. Some things
	// still want the normal order chain, so we provide both.
	while (filters[count].id != LZMA_VLI_UNKNOWN)
		++count;

	for (i = 0; i < count; ++i)
		reversed_filters[count - i - 1] = filters[i];

	reversed_filters[count].id = LZMA_VLI_UNKNOWN;

	return strm->internal->next.update(strm->internal->next.coder,
			strm->allocator, filters, reversed_filters);
}